

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void __thiscall ImGuiContext::ImGuiContext(ImGuiContext *this,ImFontAtlas *shared_font_atlas)

{
  int *piVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  ImRect IVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  ImGuiIO::ImGuiIO(&this->IO);
  ImGuiStyle::ImGuiStyle(&this->Style);
  ImDrawListSharedData::ImDrawListSharedData(&this->DrawListSharedData);
  (this->WheelingWindowRefMousePos).x = 0.0;
  (this->WheelingWindowRefMousePos).y = 0.0;
  (this->ActiveIdClickOffset).x = 0.0;
  (this->ActiveIdClickOffset).y = 0.0;
  (this->NavScoringRect).Min.x = 0.0;
  (this->NavScoringRect).Min.y = 0.0;
  (this->NavScoringRect).Max.x = 0.0;
  (this->NavScoringRect).Max.y = 0.0;
  (this->NavInitResultRectRel).Min.x = 0.0;
  (this->NavInitResultRectRel).Min.y = 0.0;
  (this->NavInitResultRectRel).Max.x = 0.0;
  (this->NavInitResultRectRel).Max.y = 0.0;
  (this->NavMoveResultLocal).RectRel.Min.x = 0.0;
  (this->NavMoveResultLocal).RectRel.Min.y = 0.0;
  (this->NavMoveResultLocal).RectRel.Max.x = 0.0;
  (this->NavMoveResultLocal).RectRel.Max.y = 0.0;
  (this->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (this->NavMoveResultLocal).ID = 0;
  (this->NavMoveResultLocal).FocusScopeId = 0;
  auVar6 = ZEXT816(0) << 0x40;
  auVar5 = ZEXT1632(auVar6);
  auVar3 = auVar5._0_16_;
  auVar7 = auVar5._16_16_;
  (this->Windows).Size = auVar3._0_4_;
  (this->Windows).Capacity = auVar3._4_4_;
  (this->Windows).Data = (ImGuiWindow **)auVar3._8_8_;
  (this->WindowsFocusOrder).Size = auVar7._0_4_;
  (this->WindowsFocusOrder).Capacity = auVar7._4_4_;
  (this->WindowsFocusOrder).Data = (ImGuiWindow **)auVar7._8_8_;
  auVar3 = auVar5._0_16_;
  auVar7 = auVar5._16_16_;
  (this->WindowsTempSortBuffer).Size = auVar3._0_4_;
  (this->WindowsTempSortBuffer).Capacity = auVar3._4_4_;
  (this->WindowsTempSortBuffer).Data = (ImGuiWindow **)auVar3._8_8_;
  (this->CurrentWindowStack).Size = auVar7._0_4_;
  (this->CurrentWindowStack).Capacity = auVar7._4_4_;
  (this->CurrentWindowStack).Data = (ImGuiWindow **)auVar7._8_8_;
  auVar5 = ZEXT1632(auVar6);
  auVar3 = auVar5._0_16_;
  (this->CurrentWindowStack).Size = auVar3._0_4_;
  (this->CurrentWindowStack).Capacity = auVar3._4_4_;
  (this->CurrentWindowStack).Data = (ImGuiWindow **)auVar3._8_8_;
  this->WindowsById = (ImGuiStorage)auVar5._16_16_;
  (this->NextWindowData).Flags = auVar5._0_4_;
  (this->NextWindowData).PosCond = auVar5._4_4_;
  (this->NextWindowData).SizeCond = auVar5._8_4_;
  (this->NextWindowData).CollapsedCond = auVar5._12_4_;
  (this->NextWindowData).PosVal.x = (float)(int)auVar5._16_8_;
  (this->NextWindowData).PosVal.y = (float)(int)((ulong)auVar5._16_8_ >> 0x20);
  (this->NextWindowData).PosPivotVal.x = (float)(int)auVar5._24_8_;
  (this->NextWindowData).PosPivotVal.y = (float)(int)((ulong)auVar5._24_8_ >> 0x20);
  (this->NextWindowData).SizeVal.x = (float)(int)auVar5._0_8_;
  (this->NextWindowData).SizeVal.y = (float)(int)((ulong)auVar5._0_8_ >> 0x20);
  (this->NextWindowData).ContentSizeVal.x = (float)(int)auVar5._8_8_;
  (this->NextWindowData).ContentSizeVal.y = (float)(int)((ulong)auVar5._8_8_ >> 0x20);
  (this->NextWindowData).ScrollVal.x = (float)(int)auVar5._16_8_;
  (this->NextWindowData).ScrollVal.y = (float)(int)((ulong)auVar5._16_8_ >> 0x20);
  (this->NextWindowData).CollapsedVal = (bool)auVar5[0x18];
  *(int3 *)&(this->NextWindowData).field_0x39 = auVar5._25_3_;
  (this->NextWindowData).SizeConstraintRect.Min.x = (float)auVar5._28_4_;
  *(undefined1 (*) [32])&(this->NextWindowData).SizeConstraintRect.Min.y = auVar5;
  auVar5 = ZEXT1632(auVar6);
  *(undefined1 (*) [32])&(this->NextWindowData).BgAlphaVal = auVar5;
  *(undefined4 *)&(this->NextItemData).OpenVal = 0;
  auVar3 = auVar5._0_16_;
  auVar7 = auVar5._16_16_;
  (this->ColorStack).Size = auVar3._0_4_;
  (this->ColorStack).Capacity = auVar3._4_4_;
  (this->ColorStack).Data = (ImGuiColorMod *)auVar3._8_8_;
  (this->StyleVarStack).Size = auVar7._0_4_;
  (this->StyleVarStack).Capacity = auVar7._4_4_;
  (this->StyleVarStack).Data = (ImGuiStyleMod *)auVar7._8_8_;
  auVar3 = auVar5._0_16_;
  auVar7 = auVar5._16_16_;
  (this->FontStack).Size = auVar3._0_4_;
  (this->FontStack).Capacity = auVar3._4_4_;
  (this->FontStack).Data = (ImFont **)auVar3._8_8_;
  (this->FocusScopeStack).Size = auVar7._0_4_;
  (this->FocusScopeStack).Capacity = auVar7._4_4_;
  (this->FocusScopeStack).Data = (uint *)auVar7._8_8_;
  auVar3 = auVar5._0_16_;
  auVar7 = auVar5._16_16_;
  (this->ItemFlagsStack).Size = auVar3._0_4_;
  (this->ItemFlagsStack).Capacity = auVar3._4_4_;
  (this->ItemFlagsStack).Data = (int *)auVar3._8_8_;
  (this->GroupStack).Size = auVar7._0_4_;
  (this->GroupStack).Capacity = auVar7._4_4_;
  (this->GroupStack).Data = (ImGuiGroupData *)auVar7._8_8_;
  auVar3 = auVar5._0_16_;
  auVar7 = auVar5._16_16_;
  (this->OpenPopupStack).Size = auVar3._0_4_;
  (this->OpenPopupStack).Capacity = auVar3._4_4_;
  (this->OpenPopupStack).Data = (ImGuiPopupData *)auVar3._8_8_;
  (this->BeginPopupStack).Size = auVar7._0_4_;
  (this->BeginPopupStack).Capacity = auVar7._4_4_;
  (this->BeginPopupStack).Data = (ImGuiPopupData *)auVar7._8_8_;
  auVar3 = auVar5._0_16_;
  auVar7 = auVar5._16_16_;
  (this->BeginPopupStack).Size = auVar3._0_4_;
  (this->BeginPopupStack).Capacity = auVar3._4_4_;
  (this->BeginPopupStack).Data = (ImGuiPopupData *)auVar3._8_8_;
  (this->Viewports).Size = auVar7._0_4_;
  (this->Viewports).Capacity = auVar7._4_4_;
  (this->Viewports).Data = (ImGuiViewportP **)auVar7._8_8_;
  (this->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  auVar3._8_4_ = 0x7f7fffff;
  auVar3._0_8_ = 0x7f7fffff7f7fffff;
  auVar3._12_4_ = 0x7f7fffff;
  uVar2 = vmovlps_avx(auVar3);
  (this->NavMoveResultLocal).DistBox = (float)(int)uVar2;
  (this->NavMoveResultLocal).DistCenter = (float)(int)((ulong)uVar2 >> 0x20);
  (this->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
  (this->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
  (this->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
  (this->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
  (this->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (this->NavMoveResultLocalVisibleSet).ID = 0;
  (this->NavMoveResultLocalVisibleSet).FocusScopeId = 0;
  (this->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  uVar2 = vmovlps_avx(auVar3);
  (this->NavMoveResultLocalVisibleSet).DistBox = (float)(int)uVar2;
  (this->NavMoveResultLocalVisibleSet).DistCenter = (float)(int)((ulong)uVar2 >> 0x20);
  (this->NavMoveResultOther).RectRel.Min.x = 0.0;
  (this->NavMoveResultOther).RectRel.Min.y = 0.0;
  (this->NavMoveResultOther).RectRel.Max.x = 0.0;
  (this->NavMoveResultOther).RectRel.Max.y = 0.0;
  (this->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (this->NavMoveResultOther).ID = 0;
  (this->NavMoveResultOther).FocusScopeId = 0;
  (this->NavMoveResultOther).DistAxial = 3.4028235e+38;
  uVar2 = vmovlps_avx(auVar3);
  (this->NavMoveResultOther).DistBox = (float)(int)uVar2;
  (this->NavMoveResultOther).DistCenter = (float)(int)((ulong)uVar2 >> 0x20);
  *(undefined1 (*) [32])(this->DragDropPayload).DataType = auVar5;
  (this->DragDropPayload).DataType[0x20] = '\0';
  (this->DragDropPayload).Data = (void *)0x0;
  (this->DragDropPayload).DataSize = 0;
  (this->DragDropPayload).SourceId = 0;
  (this->DragDropPayload).SourceParentId = 0;
  (this->DragDropPayload).DataFrameCount = -1;
  (this->DragDropPayload).Preview = false;
  (this->DragDropPayload).Delivery = false;
  (this->DragDropTargetRect).Min.x = 0.0;
  (this->DragDropTargetRect).Min.y = 0.0;
  (this->DragDropTargetRect).Max.x = 0.0;
  (this->DragDropTargetRect).Max.y = 0.0;
  (this->DragDropPayloadBufHeap).Size = 0;
  (this->DragDropPayloadBufHeap).Capacity = 0;
  (this->DragDropPayloadBufHeap).Data = (uchar *)0x0;
  (this->Tables).FreeIdx = 0;
  auVar3 = auVar5._0_16_;
  (this->Tables).Buf.Size = auVar3._0_4_;
  (this->Tables).Buf.Capacity = auVar3._4_4_;
  (this->Tables).Buf.Data = (ImGuiTable *)auVar3._8_8_;
  (this->Tables).Map = (ImGuiStorage)auVar5._16_16_;
  (this->TabBars).FreeIdx = 0;
  auVar5 = ZEXT1632(auVar6);
  auVar3 = auVar5._0_16_;
  (this->TabBars).Buf.Size = auVar3._0_4_;
  (this->TabBars).Buf.Capacity = auVar3._4_4_;
  (this->TabBars).Buf.Data = (ImGuiTabBar *)auVar3._8_8_;
  (this->TabBars).Map = (ImGuiStorage)auVar5._16_16_;
  auVar3 = auVar5._0_16_;
  auVar6 = auVar5._16_16_;
  (this->TablesLastTimeActive).Size = auVar3._0_4_;
  (this->TablesLastTimeActive).Capacity = auVar3._4_4_;
  (this->TablesLastTimeActive).Data = (float *)auVar3._8_8_;
  (this->DrawChannelsTempMergeBuffer).Size = auVar6._0_4_;
  (this->DrawChannelsTempMergeBuffer).Capacity = auVar6._4_4_;
  (this->DrawChannelsTempMergeBuffer).Data = (ImDrawChannel *)auVar6._8_8_;
  auVar3 = auVar5._0_16_;
  auVar6 = auVar5._16_16_;
  (this->CurrentTableStack).Size = auVar3._0_4_;
  (this->CurrentTableStack).Capacity = auVar3._4_4_;
  (this->CurrentTableStack).Data = (ImGuiPtrOrIndex *)auVar3._8_8_;
  (this->TablesLastTimeActive).Size = auVar6._0_4_;
  (this->TablesLastTimeActive).Capacity = auVar6._4_4_;
  (this->TablesLastTimeActive).Data = (float *)auVar6._8_8_;
  memset(&this->CurrentTabBarStack,0,0xec0);
  ImFont::ImFont(&this->InputTextPasswordFont);
  (this->ColorPickerRef).x = 0.0;
  (this->ColorPickerRef).y = 0.0;
  (this->ColorPickerRef).z = 0.0;
  (this->ColorPickerRef).w = 0.0;
  (this->LogBuffer).Buf.Size = 0;
  (this->LogBuffer).Buf.Capacity = 0;
  (this->LogBuffer).Buf.Data = (char *)0x0;
  auVar5 = ZEXT1632(ZEXT816(0) << 0x40);
  auVar3 = auVar5._0_16_;
  auVar6 = auVar5._16_16_;
  (this->ClipboardHandlerData).Size = auVar3._0_4_;
  (this->ClipboardHandlerData).Capacity = auVar3._4_4_;
  (this->ClipboardHandlerData).Data = (char *)auVar3._8_8_;
  (this->MenusIdSubmittedThisFrame).Size = auVar6._0_4_;
  (this->MenusIdSubmittedThisFrame).Capacity = auVar6._4_4_;
  (this->MenusIdSubmittedThisFrame).Data = (uint *)auVar6._8_8_;
  auVar3 = auVar5._0_16_;
  (this->MenusIdSubmittedThisFrame).Size = auVar3._0_4_;
  (this->MenusIdSubmittedThisFrame).Capacity = auVar3._4_4_;
  (this->MenusIdSubmittedThisFrame).Data = (uint *)auVar3._8_8_;
  (this->PlatformImePos).x = (float)(int)auVar5._16_8_;
  (this->PlatformImePos).y = (float)(int)((ulong)auVar5._16_8_ >> 0x20);
  (this->PlatformImeLastPos).x = (float)(int)auVar5._24_8_;
  (this->PlatformImeLastPos).y = (float)(int)((ulong)auVar5._24_8_ >> 0x20);
  auVar5 = ZEXT1632(ZEXT816(0) << 0x40);
  auVar3 = auVar5._16_16_;
  this->SettingsIniData = (ImGuiTextBuffer)auVar5._0_16_;
  (this->SettingsHandlers).Size = auVar3._0_4_;
  (this->SettingsHandlers).Capacity = auVar3._4_4_;
  (this->SettingsHandlers).Data = (ImGuiSettingsHandler *)auVar3._8_8_;
  this->SettingsWindows = (ImChunkStream<ImGuiWindowSettings>)auVar5._0_16_;
  this->SettingsTables = (ImChunkStream<ImGuiTableSettings>)auVar5._16_16_;
  auVar3 = auVar5._16_16_;
  this->SettingsTables = (ImChunkStream<ImGuiTableSettings>)auVar5._0_16_;
  (this->Hooks).Size = auVar3._0_4_;
  (this->Hooks).Capacity = auVar3._4_4_;
  (this->Hooks).Data = (ImGuiContextHook *)auVar3._8_8_;
  (this->DebugMetricsConfig).ShowWindowsRects = false;
  (this->DebugMetricsConfig).ShowWindowsBeginOrder = false;
  (this->DebugMetricsConfig).ShowTablesRects = false;
  (this->DebugMetricsConfig).ShowDrawCmdMesh = true;
  (this->DebugMetricsConfig).ShowDrawCmdBoundingBoxes = true;
  (this->DebugMetricsConfig).ShowWindowsRectsType = -1;
  (this->DebugMetricsConfig).ShowTablesRectsType = -1;
  this->Initialized = false;
  this->FontAtlasOwnedByContext = shared_font_atlas == (ImFontAtlas *)0x0;
  this->Font = (ImFont *)0x0;
  this->FontSize = 0.0;
  this->FontBaseSize = 0.0;
  if (shared_font_atlas == (ImFontAtlas *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    shared_font_atlas = (ImFontAtlas *)(*GImAllocatorAllocFunc)(0x488,GImAllocatorUserData);
    ImFontAtlas::ImFontAtlas(shared_font_atlas);
  }
  (this->IO).Fonts = shared_font_atlas;
  this->Time = 0.0;
  this->FrameCount = 0;
  this->FrameCountEnded = -1;
  this->FrameCountRendered = -1;
  this->WithinFrameScope = false;
  this->WithinFrameScopeWithImplicitWindow = false;
  this->WithinEndChild = false;
  this->GcCompactAll = false;
  this->TestEngineHookIdInfo = 0;
  this->TestEngine = (void *)0x0;
  this->WindowsActiveCount = 0;
  this->ActiveIdUsingNavDirMask = 0;
  this->ActiveIdUsingNavInputMask = 0;
  this->ActiveIdUsingKeyInputMask = 0;
  this->TestEngineHookItems = false;
  auVar3 = ZEXT816(0) << 0x40;
  auVar5 = ZEXT1632(auVar3);
  this->CurrentWindow = (ImGuiWindow *)auVar5._0_8_;
  this->HoveredWindow = (ImGuiWindow *)auVar5._8_8_;
  this->HoveredRootWindow = (ImGuiWindow *)auVar5._16_8_;
  this->HoveredWindowUnderMovingWindow = (ImGuiWindow *)auVar5._24_8_;
  this->HoveredRootWindow = (ImGuiWindow *)auVar5._0_8_;
  this->HoveredWindowUnderMovingWindow = (ImGuiWindow *)auVar5._8_8_;
  this->MovingWindow = (ImGuiWindow *)auVar5._16_8_;
  this->WheelingWindow = (ImGuiWindow *)auVar5._24_8_;
  auVar5 = ZEXT1632(auVar3);
  this->WheelingWindowTimer = (float)auVar5._0_4_;
  this->HoveredId = auVar5._4_4_;
  this->HoveredIdPreviousFrame = auVar5._8_4_;
  this->HoveredIdAllowOverlap = (bool)auVar5[0xc];
  this->HoveredIdUsingMouseWheel = (bool)auVar5[0xd];
  this->HoveredIdPreviousFrameUsingMouseWheel = (bool)auVar5[0xe];
  this->HoveredIdDisabled = (bool)auVar5[0xf];
  this->HoveredIdTimer = (float)auVar5._16_4_;
  this->HoveredIdNotActiveTimer = (float)auVar5._20_4_;
  this->ActiveId = auVar5._24_4_;
  this->ActiveIdIsAlive = auVar5._28_4_;
  *(undefined1 (*) [32])((long)&this->HoveredIdPreviousFrame + 3) = auVar5;
  (this->ActiveIdClickOffset).x = -1.0;
  (this->ActiveIdClickOffset).y = -1.0;
  IVar4 = (ImRect)(ZEXT816(0) << 0x20);
  this->ActiveIdWindow = (ImGuiWindow *)IVar4.Min;
  this->ActiveIdSource = (ImGuiInputSource)IVar4.Max.x;
  this->ActiveIdMouseButton = (int)IVar4.Max.y;
  *(undefined8 *)((long)&this->ActiveIdMouseButton + 2) = 0;
  this->ActiveIdPreviousFrameWindow = (ImGuiWindow *)IVar4.Min;
  this->LastActiveId = (ImGuiID)IVar4.Max.x;
  this->LastActiveIdTimer = IVar4.Max.y;
  this->NavActivatePressedId = auVar5._0_4_;
  this->NavInputId = auVar5._4_4_;
  this->NavJustTabbedId = auVar5._8_4_;
  this->NavJustMovedToId = auVar5._12_4_;
  this->NavJustMovedToFocusScopeId = auVar5._16_4_;
  this->NavJustMovedToKeyMods = auVar5._20_4_;
  this->NavNextActivateId = auVar5._24_4_;
  this->NavInputSource = auVar5._28_4_;
  this->NavWindow = (ImGuiWindow *)auVar5._0_8_;
  this->NavId = auVar5._8_4_;
  this->NavFocusScopeId = auVar5._12_4_;
  this->NavActivateId = auVar5._16_4_;
  this->NavActivateDownId = auVar5._20_4_;
  this->NavActivatePressedId = auVar5._24_4_;
  this->NavInputId = auVar5._28_4_;
  this->NavScoringRect = IVar4;
  this->NavScoringCount = 0;
  this->NavLayer = ImGuiNavLayer_Main;
  this->NavIdTabCounter = 0x7fffffff;
  this->NavIdIsAlive = false;
  this->NavMousePosDirty = false;
  this->NavDisableHighlight = true;
  this->NavInitResultId = 0;
  this->NavMoveRequest = false;
  this->NavDisableMouseHover = false;
  this->NavAnyRequest = false;
  this->NavInitRequest = false;
  this->NavInitRequestFromMove = false;
  this->NavMoveDirLast = -1;
  this->NavMoveClipDir = -1;
  this->NavMoveRequestFlags = 0;
  this->NavMoveRequestForward = ImGuiNavForward_None;
  this->NavMoveRequestKeyMods = 0;
  this->NavMoveDir = -1;
  this->NavWrapRequestWindow = (ImGuiWindow *)0x0;
  this->NavWrapRequestFlags = 0;
  auVar5 = ZEXT1632(auVar3);
  this->NavWindowingTarget = (ImGuiWindow *)auVar5._0_8_;
  this->NavWindowingTargetAnim = (ImGuiWindow *)auVar5._8_8_;
  this->NavWindowingListWindow = (ImGuiWindow *)auVar5._16_8_;
  this->NavWindowingTimer = (float)auVar5._24_4_;
  this->NavWindowingHighlightAlpha = (float)auVar5._28_4_;
  this->NavWindowingToggleLayer = false;
  this->FocusRequestCurrWindow = (ImGuiWindow *)IVar4.Min;
  this->FocusRequestNextWindow = (ImGuiWindow *)IVar4.Max;
  this->FocusRequestCurrCounterRegular = 0x7fffffff;
  this->FocusRequestCurrCounterTabStop = 0x7fffffff;
  this->FocusRequestNextCounterRegular = 0x7fffffff;
  this->FocusRequestNextCounterTabStop = 0x7fffffff;
  this->FocusTabPressed = false;
  this->DragDropSourceFlags = 0;
  *(undefined4 *)((long)&this->MouseCursor + 3) = 0;
  this->DimBgRatio = 0.0;
  this->MouseCursor = 0;
  this->DragDropSourceFrameCount = -1;
  this->DragDropMouseButton = -1;
  this->DragDropTargetId = (ImGuiID)IVar4.Min.x;
  this->DragDropAcceptFlags = (ImGuiDragDropFlags)IVar4.Min.y;
  this->DragDropAcceptIdCurrRectSurface = IVar4.Max.x;
  this->DragDropAcceptIdCurr = (ImGuiID)IVar4.Max.y;
  this->DragDropAcceptIdPrev = 0;
  this->DragDropAcceptFrameCount = -1;
  this->DragDropHoldJustPressedId = 0;
  this->CurrentTabBar = (ImGuiTabBar *)0x0;
  (this->LastValidMousePos).x = 0.0;
  (this->LastValidMousePos).y = 0.0;
  this->TempInputId = 0;
  this->ColorEditOptions = 0xa900000;
  *(ImRect *)this->DragDropPayloadBufLocal = IVar4;
  this->CurrentTable = (ImGuiTable *)0x0;
  this->ColorEditLastColor[2] = 3.4028235e+38;
  this->ColorEditLastHue = 0.0;
  this->ColorEditLastSat = 0.0;
  this->ColorEditLastColor[0] = 3.4028235e+38;
  this->ColorEditLastColor[1] = 3.4028235e+38;
  this->SliderCurrentAccum = 0.0;
  this->SliderCurrentAccumDirty = false;
  this->DragCurrentAccumDirty = false;
  this->DragCurrentAccum = 0.0;
  this->DragSpeedDefaultRatio = 0.01;
  this->ScrollbarClickDeltaToGrabCenter = 0.0;
  this->TooltipOverrideCount = 0;
  this->TooltipSlowDelay = 0.5;
  (this->PlatformImePos).x = 3.4028235e+38;
  (this->PlatformImePos).y = 3.4028235e+38;
  (this->PlatformImeLastPos).x = 3.4028235e+38;
  (this->PlatformImeLastPos).y = 3.4028235e+38;
  this->PlatformLocaleDecimalPoint = '.';
  this->SettingsLoaded = false;
  this->SettingsDirtyTimer = 0.0;
  this->HookIdNext = 0;
  this->LogEnabled = false;
  this->LogType = ImGuiLogType_None;
  this->LogFile = (ImFileHandle)0x0;
  this->LogNextPrefix = (char *)IVar4.Min;
  this->LogNextSuffix = (char *)IVar4.Max;
  this->LogLinePosY = 3.4028235e+38;
  this->LogLineFirstItem = false;
  this->LogDepthRef = 0;
  this->LogDepthToExpandDefault = 2;
  this->LogDepthToExpand = 2;
  this->DebugItemPickerActive = false;
  this->DebugItemPickerBreakId = 0;
  memset(this->FramerateSecPerFrame,0,0x1e8);
  this->WantTextInputNextFrame = -1;
  this->WantCaptureMouseNextFrame = -1;
  this->WantCaptureKeyboardNextFrame = -1;
  memset(this->TempBuffer,0,0xc01);
  return;
}

Assistant:

ImGuiContext(ImFontAtlas* shared_font_atlas)
    {
        Initialized = false;
        FontAtlasOwnedByContext = shared_font_atlas ? false : true;
        Font = NULL;
        FontSize = FontBaseSize = 0.0f;
        IO.Fonts = shared_font_atlas ? shared_font_atlas : IM_NEW(ImFontAtlas)();
        Time = 0.0f;
        FrameCount = 0;
        FrameCountEnded = FrameCountRendered = -1;
        WithinFrameScope = WithinFrameScopeWithImplicitWindow = WithinEndChild = false;
        GcCompactAll = false;
        TestEngineHookItems = false;
        TestEngineHookIdInfo = 0;
        TestEngine = NULL;

        WindowsActiveCount = 0;
        CurrentWindow = NULL;
        HoveredWindow = NULL;
        HoveredRootWindow = NULL;
        HoveredWindowUnderMovingWindow = NULL;
        MovingWindow = NULL;
        WheelingWindow = NULL;
        WheelingWindowTimer = 0.0f;

        HoveredId = HoveredIdPreviousFrame = 0;
        HoveredIdAllowOverlap = false;
        HoveredIdUsingMouseWheel = HoveredIdPreviousFrameUsingMouseWheel = false;
        HoveredIdDisabled = false;
        HoveredIdTimer = HoveredIdNotActiveTimer = 0.0f;
        ActiveId = 0;
        ActiveIdIsAlive = 0;
        ActiveIdTimer = 0.0f;
        ActiveIdIsJustActivated = false;
        ActiveIdAllowOverlap = false;
        ActiveIdNoClearOnFocusLoss = false;
        ActiveIdHasBeenPressedBefore = false;
        ActiveIdHasBeenEditedBefore = false;
        ActiveIdHasBeenEditedThisFrame = false;
        ActiveIdUsingMouseWheel = false;
        ActiveIdUsingNavDirMask = 0x00;
        ActiveIdUsingNavInputMask = 0x00;
        ActiveIdUsingKeyInputMask = 0x00;
        ActiveIdClickOffset = ImVec2(-1, -1);
        ActiveIdWindow = NULL;
        ActiveIdSource = ImGuiInputSource_None;
        ActiveIdMouseButton = 0;
        ActiveIdPreviousFrame = 0;
        ActiveIdPreviousFrameIsAlive = false;
        ActiveIdPreviousFrameHasBeenEditedBefore = false;
        ActiveIdPreviousFrameWindow = NULL;
        LastActiveId = 0;
        LastActiveIdTimer = 0.0f;

        NavWindow = NULL;
        NavId = NavFocusScopeId = NavActivateId = NavActivateDownId = NavActivatePressedId = NavInputId = 0;
        NavJustTabbedId = NavJustMovedToId = NavJustMovedToFocusScopeId = NavNextActivateId = 0;
        NavJustMovedToKeyMods = ImGuiKeyModFlags_None;
        NavInputSource = ImGuiInputSource_None;
        NavScoringRect = ImRect();
        NavScoringCount = 0;
        NavLayer = ImGuiNavLayer_Main;
        NavIdTabCounter = INT_MAX;
        NavIdIsAlive = false;
        NavMousePosDirty = false;
        NavDisableHighlight = true;
        NavDisableMouseHover = false;
        NavAnyRequest = false;
        NavInitRequest = false;
        NavInitRequestFromMove = false;
        NavInitResultId = 0;
        NavMoveRequest = false;
        NavMoveRequestFlags = ImGuiNavMoveFlags_None;
        NavMoveRequestForward = ImGuiNavForward_None;
        NavMoveRequestKeyMods = ImGuiKeyModFlags_None;
        NavMoveDir = NavMoveDirLast = NavMoveClipDir = ImGuiDir_None;
        NavWrapRequestWindow = NULL;
        NavWrapRequestFlags = ImGuiNavMoveFlags_None;

        NavWindowingTarget = NavWindowingTargetAnim = NavWindowingListWindow = NULL;
        NavWindowingTimer = NavWindowingHighlightAlpha = 0.0f;
        NavWindowingToggleLayer = false;

        FocusRequestCurrWindow = FocusRequestNextWindow = NULL;
        FocusRequestCurrCounterRegular = FocusRequestCurrCounterTabStop = INT_MAX;
        FocusRequestNextCounterRegular = FocusRequestNextCounterTabStop = INT_MAX;
        FocusTabPressed = false;

        DimBgRatio = 0.0f;
        MouseCursor = ImGuiMouseCursor_Arrow;

        DragDropActive = DragDropWithinSource = DragDropWithinTarget = false;
        DragDropSourceFlags = ImGuiDragDropFlags_None;
        DragDropSourceFrameCount = -1;
        DragDropMouseButton = -1;
        DragDropTargetId = 0;
        DragDropAcceptFlags = ImGuiDragDropFlags_None;
        DragDropAcceptIdCurrRectSurface = 0.0f;
        DragDropAcceptIdPrev = DragDropAcceptIdCurr = 0;
        DragDropAcceptFrameCount = -1;
        DragDropHoldJustPressedId = 0;
        memset(DragDropPayloadBufLocal, 0, sizeof(DragDropPayloadBufLocal));

        CurrentTable = NULL;
        CurrentTabBar = NULL;

        LastValidMousePos = ImVec2(0.0f, 0.0f);
        TempInputId = 0;
        ColorEditOptions = ImGuiColorEditFlags__OptionsDefault;
        ColorEditLastHue = ColorEditLastSat = 0.0f;
        ColorEditLastColor[0] = ColorEditLastColor[1] = ColorEditLastColor[2] = FLT_MAX;
        SliderCurrentAccum = 0.0f;
        SliderCurrentAccumDirty = false;
        DragCurrentAccumDirty = false;
        DragCurrentAccum = 0.0f;
        DragSpeedDefaultRatio = 1.0f / 100.0f;
        ScrollbarClickDeltaToGrabCenter = 0.0f;
        TooltipOverrideCount = 0;
        TooltipSlowDelay = 0.50f;

        PlatformImePos = PlatformImeLastPos = ImVec2(FLT_MAX, FLT_MAX);
        PlatformLocaleDecimalPoint = '.';

        SettingsLoaded = false;
        SettingsDirtyTimer = 0.0f;
        HookIdNext = 0;

        LogEnabled = false;
        LogType = ImGuiLogType_None;
        LogNextPrefix = LogNextSuffix = NULL;
        LogFile = NULL;
        LogLinePosY = FLT_MAX;
        LogLineFirstItem = false;
        LogDepthRef = 0;
        LogDepthToExpand = LogDepthToExpandDefault = 2;

        DebugItemPickerActive = false;
        DebugItemPickerBreakId = 0;

        memset(FramerateSecPerFrame, 0, sizeof(FramerateSecPerFrame));
        FramerateSecPerFrameIdx = 0;
        FramerateSecPerFrameAccum = 0.0f;
        WantCaptureMouseNextFrame = WantCaptureKeyboardNextFrame = WantTextInputNextFrame = -1;
        memset(TempBuffer, 0, sizeof(TempBuffer));
    }